

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

Boolean llvm::isLegalUTF8String(UTF8 **source,UTF8 *sourceEnd)

{
  Boolean BVar1;
  int length_00;
  int length;
  UTF8 *sourceEnd_local;
  UTF8 **source_local;
  
  while( true ) {
    if (*source == sourceEnd) {
      return '\x01';
    }
    length_00 = (char)trailingBytesForUTF8[**source] + 1;
    if (((long)sourceEnd - (long)*source < (long)length_00) ||
       (BVar1 = isLegalUTF8(*source,length_00), BVar1 == '\0')) break;
    *source = *source + length_00;
  }
  return '\0';
}

Assistant:

Boolean isLegalUTF8String(const UTF8 **source, const UTF8 *sourceEnd) {
    while (*source != sourceEnd) {
        int length = trailingBytesForUTF8[**source] + 1;
        if (length > sourceEnd - *source || !isLegalUTF8(*source, length))
            return false;
        *source += length;
    }
    return true;
}